

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_attr<tinyusdz::value::matrix4d>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::value::matrix4d>_> *attr,
                   string *name,uint32_t indent)

{
  char cVar1;
  Path *v;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  value_type *pvVar6;
  ostream *poVar7;
  long lVar8;
  uint32_t indent_00;
  pointer pPVar9;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  char *pcVar10;
  string *psVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  string local_308 [4];
  optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_> local_288;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  bVar14 = 0;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  bVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::authored(attr);
  if (!bVar2) goto LAB_002529f1;
  bVar3 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::is_value_empty(attr);
  pPVar9 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar12 = pPVar9 != (attr->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_start;
  bVar2 = (attr->_attrib).has_value_;
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::optional
            (&local_288,&attr->_attrib);
  if (local_288.has_value_ == true) {
    pvVar6 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::
             value(&local_288);
    cVar1 = pvVar6->_has_value;
  }
  else {
    cVar1 = '\0';
  }
  if ((local_288.has_value_ & 1U) == 0) {
    bVar4 = false;
  }
  else {
    pvVar6 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::
             value(&local_288);
    bVar4 = Animatable<tinyusdz::value::matrix4d>::has_timesamples(pvVar6);
  }
  if ((((local_288.has_value_ & 1U) == 0) ||
      (pvVar6 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::
                value(&local_288), pvVar6->_blocked != false)) || (pvVar6->_has_value != false)) {
    bVar13 = false;
  }
  else {
    pPVar9 = (pointer)(pvVar6->_ts)._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    bVar13 = pPVar9 != (pointer)(pvVar6->_ts)._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
  }
  indent_00 = (uint32_t)pPVar9;
  bVar5 = AttrMetas::authored(&attr->_metas);
  if (((bVar5) || ((byte)(bVar12 & (bVar2 ^ 1U) | bVar13) != 1)) ||
     (n_01 = n, (bVar3 || attr->_blocked != false) || cVar1 != '\0')) {
    pprint::Indent_abi_cxx11_(local_308,(pprint *)(ulong)indent,n);
    ::std::operator<<(local_1a8,(string *)local_308);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
    poVar7 = ::std::operator<<(local_1a8,(string *)local_308);
    poVar7 = ::std::operator<<(poVar7," ");
    ::std::operator<<(poVar7,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    if (attr->_blocked == true) {
      pcVar10 = " = None";
LAB_00252794:
      ::std::operator<<(local_1a8,pcVar10);
    }
    else if (cVar1 != '\0') {
      pvVar6 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::
               value(&local_288);
      if ((pvVar6->_blocked != false) || (pvVar6->_has_value != true)) {
        pcVar10 = " = [InternalError]";
        goto LAB_00252794;
      }
      psVar11 = local_308;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar11->_M_dataplus)._M_p = (pointer)(pvVar6->_value).m[0][0];
        pvVar6 = (value_type *)((long)pvVar6 + (ulong)bVar14 * -0x10 + 8);
        psVar11 = (string *)((long)psVar11 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      poVar7 = ::std::operator<<(local_1a8," = ");
      indent_00 = (uint32_t)lVar8;
      ::std::operator<<(poVar7,(matrix4d *)local_308);
    }
    bVar2 = AttrMetas::authored(&attr->_metas);
    if (bVar2) {
      poVar7 = ::std::operator<<(local_1a8,"(\n");
      print_attr_metas_abi_cxx11_
                (local_308,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar7 = ::std::operator<<(poVar7,(string *)local_308);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar7 = ::std::operator<<(poVar7,(string *)&local_1d8);
      ::std::operator<<(poVar7,")");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"\n");
    n_01 = extraout_EDX;
  }
  if (bVar4 != false) {
    pprint::Indent_abi_cxx11_(local_308,(pprint *)(ulong)indent,n_01);
    ::std::operator<<(local_1a8,(string *)local_308);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
    poVar7 = ::std::operator<<(local_1a8,(string *)local_308);
    poVar7 = ::std::operator<<(poVar7," ");
    ::std::operator<<(poVar7,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    poVar7 = ::std::operator<<(local_1a8,".timeSamples = ");
    pvVar6 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::
             value(&local_288);
    print_typed_timesamples<tinyusdz::value::matrix4d>(local_308,&pvVar6->_ts,indent);
    ::std::operator<<(poVar7,(string *)local_308);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,"\n");
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(local_308,(pprint *)(ulong)indent,n_01);
    ::std::operator<<(local_1a8,(string *)local_308);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<tinyusdz::value::matrix4d>::type_name_abi_cxx11_();
    poVar7 = ::std::operator<<(local_1a8,(string *)local_308);
    poVar7 = ::std::operator<<(poVar7," ");
    ::std::operator<<(poVar7,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,".connect = ");
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar8 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v) / 0xd0;
    if (lVar8 == 0) {
      ::std::operator<<(local_1a8,"[InternalError]");
    }
    else if (lVar8 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::operator<<(local_1a8,"\n");
  }
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::matrix4d>_>::~optional
            (&local_288);
LAB_002529f1:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}